

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O1

int __thiscall re2::NFA::Step(NFA *this,Threadq *runq,Threadq *nextq,int c,int flag,char *p)

{
  Inst *this_00;
  Thread *pTVar1;
  char *pcVar2;
  char **ppcVar3;
  char **ppcVar4;
  bool bVar5;
  uint uVar6;
  ostream *poVar7;
  int iVar8;
  pointer pIVar9;
  int iVar10;
  ulong uVar11;
  pointer pIVar12;
  bool bVar13;
  anon_union_4_5_a3ff96c3_for_Inst_2 local_1d4;
  LogMessage local_1b0;
  
  nextq->size_ = 0;
  bVar13 = runq->size_ == 0;
  if (!bVar13) {
    pIVar9 = (runq->dense_).
             super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pIVar12 = pIVar9;
    do {
      pTVar1 = pIVar12->second;
      bVar5 = false;
      if (pTVar1 != (Thread *)0x0) {
        if (((this->longest_ == true) && (this->matched_ == true)) &&
           (*this->match_ < *pTVar1->capture)) {
          iVar10 = (pTVar1->field_0).ref;
          iVar8 = iVar10 + -1;
          (pTVar1->field_0).ref = iVar8;
        }
        else {
          this_00 = this->prog_->inst_ + pIVar12->index_;
          uVar6 = this_00->out_opcode_ & 7;
          if (uVar6 == 1) {
            if ((pIVar12 == pIVar9) &&
               ((bVar5 = Prog::Inst::greedy(this_00,this->prog_), bVar5 || (this->longest_ == true))
               )) {
              iVar8 = this->ncapture_;
              if (0 < (long)iVar8) {
                ppcVar3 = this->match_;
                ppcVar4 = pTVar1->capture;
                uVar11 = 0;
                do {
                  ppcVar3[uVar11] = ppcVar4[uVar11];
                  ppcVar3[uVar11 + 1] = ppcVar4[uVar11 + 1];
                  uVar11 = uVar11 + 2;
                } while (uVar11 < (ulong)(long)iVar8);
              }
              this->matched_ = true;
              iVar10 = (pTVar1->field_0).ref;
              iVar8 = iVar10 + -1;
              (pTVar1->field_0).ref = iVar8;
              if (iVar10 < 2) {
                if (iVar8 != 0) goto LAB_0012f664;
                pTVar1->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
                this->free_threads_ = pTVar1;
              }
              while (pIVar12 = pIVar12 + 1,
                    pIVar12 !=
                    (runq->dense_).
                    super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
                    ._M_impl.super__Vector_impl_data._M_start + runq->size_) {
                pTVar1 = pIVar12->second;
                if (pTVar1 != (Thread *)0x0) {
                  iVar10 = (pTVar1->field_0).ref;
                  iVar8 = iVar10 + -1;
                  (pTVar1->field_0).ref = iVar8;
                  if (iVar10 < 2) {
                    if (iVar8 != 0) goto LAB_0012f664;
                    pTVar1->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
                    this->free_threads_ = pTVar1;
                  }
                }
              }
              runq->size_ = 0;
              bVar5 = Prog::Inst::greedy(this_00,this->prog_);
              if (bVar5) {
                if ((this_00->out_opcode_ & 6) != 0) {
                  __assert_fail("opcode() == kInstAlt || opcode() == kInstAltMatch",
                                "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h"
                                ,0x6d,"int re2::Prog::Inst::out1()");
                }
                local_1d4 = this_00->field_1;
              }
              else {
                local_1d4.out1_ = this_00->out_opcode_ >> 4;
              }
LAB_0012f5fc:
              bVar5 = true;
              goto LAB_0012f601;
            }
          }
          else if (uVar6 == 2) {
            AddToThreadq(this,nextq,this_00->out_opcode_ >> 4,c,flag,p + 1,pTVar1);
          }
          else if (uVar6 == 5) {
            if ((this->endmatch_ != true) || (this->etext_ == p)) {
              if (this->longest_ == false) {
                iVar8 = this->ncapture_;
                if (0 < (long)iVar8) {
                  ppcVar3 = this->match_;
                  ppcVar4 = pTVar1->capture;
                  uVar11 = 0;
                  do {
                    ppcVar3[uVar11] = ppcVar4[uVar11];
                    ppcVar3[uVar11 + 1] = ppcVar4[uVar11 + 1];
                    uVar11 = uVar11 + 2;
                  } while (uVar11 < (ulong)(long)iVar8);
                }
                this->match_[1] = p;
                this->matched_ = true;
                iVar10 = (pTVar1->field_0).ref;
                iVar8 = iVar10 + -1;
                (pTVar1->field_0).ref = iVar8;
                if (iVar10 < 2) {
                  if (iVar8 != 0) goto LAB_0012f664;
                  pTVar1->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
                  this->free_threads_ = pTVar1;
                }
                while (pIVar12 = pIVar12 + 1,
                      pIVar12 !=
                      (runq->dense_).
                      super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
                      ._M_impl.super__Vector_impl_data._M_start + runq->size_) {
                  pTVar1 = pIVar12->second;
                  if (pTVar1 != (Thread *)0x0) {
                    iVar10 = (pTVar1->field_0).ref;
                    iVar8 = iVar10 + -1;
                    (pTVar1->field_0).ref = iVar8;
                    if (iVar10 < 2) {
                      if (iVar8 != 0) goto LAB_0012f664;
                      pTVar1->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
                      this->free_threads_ = pTVar1;
                    }
                  }
                }
                runq->size_ = 0;
                local_1d4.out1_ = 0;
                goto LAB_0012f5fc;
              }
              if (this->matched_ == true) {
                pcVar2 = *this->match_;
                if ((pcVar2 <= *pTVar1->capture) &&
                   ((*pTVar1->capture != pcVar2 || (p <= this->match_[1])))) goto LAB_0012f504;
              }
              iVar8 = this->ncapture_;
              if (0 < (long)iVar8) {
                ppcVar3 = this->match_;
                ppcVar4 = pTVar1->capture;
                uVar11 = 0;
                do {
                  ppcVar3[uVar11] = ppcVar4[uVar11];
                  ppcVar3[uVar11 + 1] = ppcVar4[uVar11 + 1];
                  uVar11 = uVar11 + 2;
                } while (uVar11 < (ulong)(long)iVar8);
              }
              this->match_[1] = p;
              this->matched_ = true;
            }
          }
          else {
            LogMessage::LogMessage
                      (&local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc"
                       ,0x15d,3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1b0.str_,"Unhandled ",10);
            poVar7 = (ostream *)
                     std::ostream::operator<<((ostream *)&local_1b0.str_,this_00->out_opcode_ & 7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," in step",8);
            LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
          }
LAB_0012f504:
          iVar10 = (pTVar1->field_0).ref;
          iVar8 = iVar10 + -1;
          (pTVar1->field_0).ref = iVar8;
        }
        bVar5 = false;
        if (iVar10 < 2) {
          if (iVar8 != 0) {
LAB_0012f664:
            __assert_fail("(t->ref) == (0)",
                          "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc"
                          ,0xb7,"void re2::NFA::Decref(Thread *)");
          }
          pTVar1->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
          this->free_threads_ = pTVar1;
        }
      }
LAB_0012f601:
      if (bVar5) break;
      pIVar12 = pIVar12 + 1;
      pIVar9 = (runq->dense_).
               super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar13 = pIVar12 == pIVar9 + runq->size_;
    } while (!bVar13);
  }
  if (bVar13) {
    runq->size_ = 0;
    local_1d4.out1_ = 0;
  }
  return local_1d4.cap_;
}

Assistant:

int NFA::Step(Threadq* runq, Threadq* nextq, int c, int flag, const char* p) {
  nextq->clear();

  for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i) {
    Thread* t = i->second;
    if (t == NULL)
      continue;

    if (longest_) {
      // Can skip any threads started after our current best match.
      if (matched_ && match_[0] < t->capture[0]) {
        Decref(t);
        continue;
      }
    }

    int id = i->index();
    Prog::Inst* ip = prog_->inst(id);

    switch (ip->opcode()) {
      default:
        // Should only see the values handled below.
        LOG(DFATAL) << "Unhandled " << ip->opcode() << " in step";
        break;

      case kInstByteRange:
        AddToThreadq(nextq, ip->out(), c, flag, p+1, t);
        break;

      case kInstAltMatch:
        if (i != runq->begin())
          break;
        // The match is ours if we want it.
        if (ip->greedy(prog_) || longest_) {
          CopyCapture(match_, t->capture);
          matched_ = true;

          Decref(t);
          for (++i; i != runq->end(); ++i)
            Decref(i->second);
          runq->clear();
          if (ip->greedy(prog_))
            return ip->out1();
          return ip->out();
        }
        break;

      case kInstMatch:
        if (endmatch_ && p != etext_)
          break;

        if (longest_) {
          // Leftmost-longest mode: save this match only if
          // it is either farther to the left or at the same
          // point but longer than an existing match.
          if (!matched_ || t->capture[0] < match_[0] ||
              (t->capture[0] == match_[0] && p > match_[1])) {
            CopyCapture(match_, t->capture);
            match_[1] = p;
            matched_ = true;
          }
        } else {
          // Leftmost-biased mode: this match is by definition
          // better than what we've already found (see next line).
          CopyCapture(match_, t->capture);
          match_[1] = p;
          matched_ = true;

          // Cut off the threads that can only find matches
          // worse than the one we just found: don't run the
          // rest of the current Threadq.
          Decref(t);
          for (++i; i != runq->end(); ++i)
            Decref(i->second);
          runq->clear();
          return 0;
        }
        break;
    }
    Decref(t);
  }
  runq->clear();
  return 0;
}